

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

size_t __thiscall notch::io::IDXReader::readDims(IDXReader *this,istream *in)

{
  long lVar1;
  runtime_error *prVar2;
  char dims;
  char typecode;
  ulong local_30;
  size_t i;
  size_t n;
  istream *piStack_18;
  char magic [4];
  istream *in_local;
  IDXReader *this_local;
  
  piStack_18 = in;
  memset((void *)((long)&n + 4),0,4);
  std::istream::read((char *)piStack_18,(long)&n + 4);
  lVar1 = std::istream::gcount();
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    if (lVar1 != 4) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"IDXReader cannot read magic");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((n._4_1_ == '\0') && (n._5_1_ == '\0')) {
    if (n._6_1_ != '\b') {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"IDXReader: unsupported IDX type code");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((n._7_1_ < '\x05') && ('\0' < n._7_1_)) {
      return (long)n._7_1_;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"IDXReader: unsupported number of dimensions");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"IDXReader: not an IDX magic");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t readDims(std::istream &in) {
        char magic[4] = { 0, 0, 0, 0};
        in.read(magic, 4);
        size_t n = in.gcount();
        for (size_t i = 0; i<4; ++i)
        if (n != 4) {
            throw std::runtime_error("IDXReader cannot read magic");
        }
        if (magic[0] != 0 || magic[1] != 0) {
            throw std::runtime_error("IDXReader: not an IDX magic");
        }
        char typecode = magic[2];
        if (typecode != 0x08) { // unsigned byte
            throw std::runtime_error("IDXReader: unsupported IDX type code");
        }
        char dims = magic[3];
        if (dims > maxDims || dims <= 0) {
            throw std::runtime_error("IDXReader: unsupported number of dimensions");
        }
        return dims;
    }